

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.h
# Opt level: O0

void __thiscall cmCTestSVN::SVNInfo::SVNInfo(SVNInfo *this,char *path)

{
  allocator local_19;
  char *local_18;
  char *path_local;
  SVNInfo *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,path,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::__cxx11::string::string((string *)&this->URL);
  std::__cxx11::string::string((string *)&this->Root);
  std::__cxx11::string::string((string *)&this->Base);
  std::__cxx11::string::string((string *)&this->OldRevision);
  std::__cxx11::string::string((string *)&this->NewRevision);
  return;
}

Assistant:

SVNInfo(const char* path) : LocalPath(path) {}